

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexstate.cpp
# Opt level: O2

RegExState * __thiscall RegExState::operator=(RegExState *this,RegExState *other)

{
  std::
  _Rb_tree<char,_std::pair<const_char,_RegExState_*>,_std::_Select1st<std::pair<const_char,_RegExState_*>_>,_std::less<char>,_std::allocator<std::pair<const_char,_RegExState_*>_>_>
  ::operator=(&(this->m_Transition)._M_t,&(other->m_Transition)._M_t);
  this->m_nStateID = other->m_nStateID;
  std::
  _Rb_tree<RegExState_*,_RegExState_*,_std::_Identity<RegExState_*>,_std::less<RegExState_*>,_std::allocator<RegExState_*>_>
  ::operator=(&(this->m_NFAStates)._M_t,&(other->m_NFAStates)._M_t);
  return this;
}

Assistant:

RegExState& RegExState::operator=(const RegExState& other) { 
	this->m_Transition	= other.m_Transition; 
	this->m_nStateID	= other.m_nStateID;
	this->m_NFAStates	= other.m_NFAStates;
	return *this;
}